

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O2

bool cbtPolyhedralContactClipping::findSeparatingAxis
               (cbtConvexPolyhedron *hullA,cbtConvexPolyhedron *hullB,cbtTransform *transA,
               cbtTransform *transB,cbtVector3 *sep,Result *resultOut)

{
  cbtScalar *pcVar1;
  undefined8 uVar2;
  uint uVar3;
  cbtFace *pcVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  bool bVar7;
  cbtVector3 *pcVar8;
  long lVar9;
  long lVar10;
  int e1;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar27 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar15 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar16 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar35 [56];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float fVar36;
  cbtVector3 cVar37;
  cbtVector3 DeltaC2;
  float local_15c;
  cbtVector3 worldEdgeB;
  cbtScalar local_148;
  cbtVector3 wA;
  cbtVector3 worldEdgeA;
  float local_110;
  int local_10c;
  int local_108;
  cbtScalar dist;
  cbtVector3 *local_100;
  cbtVector3 dirA;
  cbtScalar d;
  ulong uStack_e0;
  cbtTransform *local_d8;
  uint local_cc;
  undefined1 local_c8 [16];
  long local_b0;
  cbtVector3 wB;
  cbtVector3 wA_2;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  cbtVector3 wB_2;
  cbtVector3 WorldEdge1;
  cbtScalar tB;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar35 = in_ZMM1._8_56_;
  auVar27 = in_ZMM0._8_56_;
  gActualSATPairTests = gActualSATPairTests + 1;
  local_100 = sep;
  cVar37 = cbtTransform::operator()(transA,&hullA->m_localCenter);
  auVar30._0_8_ = cVar37.m_floats._8_8_;
  auVar30._8_56_ = auVar35;
  auVar17._0_8_ = cVar37.m_floats._0_8_;
  auVar17._8_56_ = auVar27;
  local_c8 = auVar30._0_16_;
  cVar37 = cbtTransform::operator()(transB,&hullB->m_localCenter);
  auVar31._0_8_ = cVar37.m_floats._8_8_;
  auVar31._8_56_ = auVar35;
  auVar18._0_8_ = cVar37.m_floats._0_8_;
  auVar18._8_56_ = auVar27;
  lVar9 = 0;
  auVar12 = vsubps_avx(auVar17._0_16_,auVar18._0_16_);
  auVar13 = vsubps_avx(local_c8,auVar31._0_16_);
  auVar32 = ZEXT1664(auVar13);
  DeltaC2.m_floats = (cbtScalar  [4])vinsertps_avx(auVar12,auVar13,0x28);
  uVar3 = (hullA->m_faces).m_size;
  local_148 = 3.4028235e+38;
  for (; auVar27 = auVar32._8_56_, (ulong)(~((int)uVar3 >> 0x1f) & uVar3) * 0x30 - lVar9 != 0;
      lVar9 = lVar9 + 0x30) {
    pcVar4 = (hullA->m_faces).m_data;
    worldEdgeA.m_floats[1] = *(cbtScalar *)((long)pcVar4->m_plane + lVar9 + 4);
    worldEdgeA.m_floats[0] = *(cbtScalar *)((long)pcVar4->m_plane + lVar9);
    auVar35 = (undefined1  [56])0x0;
    worldEdgeA.m_floats[2] = *(cbtScalar *)((long)pcVar4->m_plane + lVar9 + 8);
    worldEdgeA.m_floats[3] = 0.0;
    cVar37 = ::operator*(&transA->m_basis,&worldEdgeA);
    auVar32._0_8_ = cVar37.m_floats._8_8_;
    auVar32._8_56_ = auVar27;
    auVar19._0_8_ = cVar37.m_floats._0_8_;
    auVar19._8_56_ = auVar35;
    auVar13 = auVar19._0_16_;
    auVar12 = vmovshdup_avx(auVar13);
    worldEdgeB.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13,auVar32._0_16_);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * DeltaC2.m_floats[1])),auVar13,
                              ZEXT416((uint)DeltaC2.m_floats[0]));
    auVar12 = vfmadd231ss_fma(auVar12,auVar32._0_16_,ZEXT416((uint)DeltaC2.m_floats[2]));
    if (auVar12._0_4_ < 0.0) {
      auVar14._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
      auVar14._8_4_ = auVar35._0_4_ ^ 0x80000000;
      auVar14._12_4_ = auVar35._4_4_ ^ 0x80000000;
      uVar2 = vmovlps_avx(auVar14);
      worldEdgeB.m_floats[2] = -cVar37.m_floats[2];
      worldEdgeB.m_floats[0] = (cbtScalar)(int)uVar2;
      worldEdgeB.m_floats[1] = (cbtScalar)(int)((ulong)uVar2 >> 0x20);
    }
    gExpectedNbTests = gExpectedNbTests + 1;
    if (gUseInternalObject == true) {
      bVar7 = TestInternalObjects(transA,transB,&DeltaC2,&worldEdgeB,hullA,hullB,local_148);
      if (bVar7) goto LAB_00e114e8;
    }
    else {
LAB_00e114e8:
      gActualNbTests = gActualNbTests + 1;
      bVar7 = TestSepAxis(hullA,hullB,transA,transB,&worldEdgeB,&d,&wA,&wB);
      if (!bVar7) goto LAB_00e116a8;
      auVar32 = ZEXT464((uint)local_148);
      if (d < local_148) {
        auVar32 = ZEXT1664((undefined1  [16])worldEdgeB.m_floats);
        local_148 = d;
        *&local_100->m_floats = worldEdgeB.m_floats;
      }
    }
  }
  uVar3 = (hullB->m_faces).m_size;
  for (lVar9 = 0; auVar27 = auVar32._8_56_,
      (ulong)(~((int)uVar3 >> 0x1f) & uVar3) * 0x30 - lVar9 != 0; lVar9 = lVar9 + 0x30) {
    pcVar4 = (hullB->m_faces).m_data;
    worldEdgeA.m_floats[1] = *(cbtScalar *)((long)pcVar4->m_plane + lVar9 + 4);
    worldEdgeA.m_floats[0] = *(cbtScalar *)((long)pcVar4->m_plane + lVar9);
    auVar35 = (undefined1  [56])0x0;
    worldEdgeA.m_floats[2] = *(cbtScalar *)((long)pcVar4->m_plane + lVar9 + 8);
    worldEdgeA.m_floats[3] = 0.0;
    cVar37 = ::operator*(&transB->m_basis,&worldEdgeA);
    auVar32._0_8_ = cVar37.m_floats._8_8_;
    auVar32._8_56_ = auVar27;
    auVar20._0_8_ = cVar37.m_floats._0_8_;
    auVar20._8_56_ = auVar35;
    auVar13 = auVar20._0_16_;
    auVar12 = vmovshdup_avx(auVar13);
    worldEdgeB.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13,auVar32._0_16_);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * DeltaC2.m_floats[1])),auVar13,
                              ZEXT416((uint)DeltaC2.m_floats[0]));
    auVar12 = vfmadd231ss_fma(auVar12,auVar32._0_16_,ZEXT416((uint)DeltaC2.m_floats[2]));
    if (auVar12._0_4_ < 0.0) {
      auVar15._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
      auVar15._8_4_ = auVar35._0_4_ ^ 0x80000000;
      auVar15._12_4_ = auVar35._4_4_ ^ 0x80000000;
      uVar2 = vmovlps_avx(auVar15);
      worldEdgeB.m_floats[2] = -cVar37.m_floats[2];
      worldEdgeB.m_floats[0] = (cbtScalar)(int)uVar2;
      worldEdgeB.m_floats[1] = (cbtScalar)(int)((ulong)uVar2 >> 0x20);
    }
    gExpectedNbTests = gExpectedNbTests + 1;
    if (gUseInternalObject == true) {
      bVar7 = TestInternalObjects(transA,transB,&DeltaC2,&worldEdgeB,hullA,hullB,local_148);
      if (bVar7) goto LAB_00e11639;
    }
    else {
LAB_00e11639:
      gActualNbTests = gActualNbTests + 1;
      bVar7 = TestSepAxis(hullA,hullB,transA,transB,&worldEdgeB,&d,&wA,&wB);
      if (!bVar7) goto LAB_00e116a8;
      auVar32 = ZEXT464((uint)local_148);
      if (d < local_148) {
        auVar32 = ZEXT1664((undefined1  [16])worldEdgeB.m_floats);
        local_148 = d;
        *&local_100->m_floats = worldEdgeB.m_floats;
      }
    }
  }
  local_c8._0_8_ = hullA;
  _local_88 = ZEXT816(0);
  lVar10 = 0;
  local_10c = -1;
  local_15c = 0.0;
  local_110 = 0.0;
  local_48 = ZEXT416(0) << 0x20;
  local_108 = local_10c;
  local_d8 = transA;
  while( true ) {
    cVar37.m_floats = worldEdgeB.m_floats;
    auVar27 = auVar32._8_56_;
    uVar11 = CONCAT71((int7)((ulong)lVar9 >> 8),*(int *)(local_c8._0_8_ + 0x4c) <= lVar10);
    if (*(int *)(local_c8._0_8_ + 0x4c) <= lVar10) break;
    local_cc = (uint)uVar11;
    pcVar1 = (cbtScalar *)(*(long *)(local_c8._0_8_ + 0x58) + lVar10 * 0x10);
    wA.m_floats._0_8_ = *(undefined8 *)pcVar1;
    wA.m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
    auVar35 = ZEXT856((ulong)wA.m_floats._8_8_);
    local_b0 = lVar10;
    cVar37 = ::operator*(&local_d8->m_basis,&wA);
    auVar32._0_8_ = cVar37.m_floats._8_8_;
    auVar32._8_56_ = auVar27;
    auVar21._0_8_ = cVar37.m_floats._0_8_;
    auVar21._8_56_ = auVar35;
    wB.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar32._0_16_);
    lVar10 = 0;
    for (lVar9 = 0; auVar27 = auVar32._8_56_, lVar9 < (hullB->m_uniqueEdges).m_size;
        lVar9 = lVar9 + 1) {
      pcVar1 = (cbtScalar *)((long)((hullB->m_uniqueEdges).m_data)->m_floats + lVar10);
      _d = *(undefined8 *)pcVar1;
      uStack_e0 = *(ulong *)(pcVar1 + 2);
      auVar35 = ZEXT856(uStack_e0);
      cVar37 = ::operator*(&transB->m_basis,(cbtVector3 *)&d);
      auVar33._0_8_ = cVar37.m_floats._8_8_;
      auVar33._8_56_ = auVar27;
      auVar22._0_8_ = cVar37.m_floats._0_8_;
      auVar22._8_56_ = auVar35;
      WorldEdge1.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22._0_16_,auVar33._0_16_);
      auVar35 = ZEXT856(WorldEdge1.m_floats._8_8_);
      cVar37 = cbtVector3::cross(&wB,&WorldEdge1);
      auVar32._0_8_ = cVar37.m_floats._8_8_;
      auVar32._8_56_ = auVar27;
      auVar23._0_8_ = cVar37.m_floats._0_8_;
      auVar23._8_56_ = auVar35;
      dirA.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar23._0_16_,auVar32._0_16_);
      bVar7 = IsAlmostZero(&dirA);
      if (!bVar7) {
        pcVar8 = cbtVector3::normalize(&dirA);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)pcVar8->m_floats;
        auVar12 = vmovshdup_avx(auVar16);
        dirA.m_floats[2] = (cbtScalar)*(undefined8 *)(pcVar8->m_floats + 2);
        auVar32 = ZEXT464((uint)dirA.m_floats[2]);
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * DeltaC2.m_floats[1])),auVar16,
                                  ZEXT416((uint)DeltaC2.m_floats[0]));
        auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)dirA.m_floats[2]),
                                  ZEXT416((uint)DeltaC2.m_floats[2]));
        cVar37.m_floats = *&pcVar8->m_floats;
        if (auVar12._0_4_ < 0.0) {
          auVar12._0_8_ = *(ulong *)pcVar8->m_floats ^ 0x8000000080000000;
          auVar12._8_4_ = 0x80000000;
          auVar12._12_4_ = 0x80000000;
          uVar2 = vmovlps_avx(auVar12);
          dirA.m_floats[3] = (cbtScalar)((ulong)*(undefined8 *)(pcVar8->m_floats + 2) >> 0x20);
          dirA.m_floats[2] = -dirA.m_floats[2];
          dirA.m_floats[0] = (cbtScalar)(int)uVar2;
          dirA.m_floats[1] = (cbtScalar)(int)((ulong)uVar2 >> 0x20);
          cVar37.m_floats = dirA.m_floats;
        }
        dirA.m_floats = cVar37.m_floats;
        gExpectedNbTests = gExpectedNbTests + 1;
        if (gUseInternalObject == true) {
          bVar7 = TestInternalObjects(local_d8,transB,&DeltaC2,&dirA,
                                      (cbtConvexPolyhedron *)local_c8._0_8_,hullB,local_148);
          if (!bVar7) goto LAB_00e1196c;
        }
        gActualNbTests = gActualNbTests + 1;
        bVar7 = TestSepAxis((cbtConvexPolyhedron *)local_c8._0_8_,hullB,local_d8,transB,&dirA,&dist,
                            &wA_2,&wB_2);
        cVar37 = wB_2;
        if (!bVar7) {
          uVar11 = (ulong)local_cc;
          goto LAB_00e11990;
        }
        auVar32 = ZEXT464((uint)local_148);
        wB_2 = cVar37;
        if (dist < local_148) {
          local_10c = (int)lVar9;
          local_148 = dist;
          *(undefined8 *)local_100->m_floats = dirA.m_floats._0_8_;
          *(undefined8 *)(local_100->m_floats + 2) = dirA.m_floats._8_8_;
          local_108 = (int)local_b0;
          auVar32 = ZEXT1664((undefined1  [16])wB.m_floats);
          worldEdgeB = WorldEdge1;
          local_48._8_8_ = 0;
          local_48._0_4_ = wA_2.m_floats[0];
          local_48._4_4_ = wA_2.m_floats[1];
          register0x000012c8 = 0;
          local_88._0_4_ = wB_2.m_floats[0];
          local_88._4_4_ = wB_2.m_floats[1];
          worldEdgeA = wB;
          local_110 = wA_2.m_floats[2];
          wB_2.m_floats[2] = cVar37.m_floats[2];
          local_15c = wB_2.m_floats[2];
        }
      }
LAB_00e1196c:
      lVar10 = lVar10 + 0x10;
    }
    lVar10 = local_b0 + 1;
  }
  if ((-1 < local_108) && (-1 < local_10c)) {
    auVar12 = vsubps_avx(_local_88,local_48);
    WorldEdge1.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar12,ZEXT416((uint)(local_15c - local_110)),0x28);
    dirA = worldEdgeA;
    wA_2.m_floats[0] = worldEdgeB.m_floats[0];
    wA_2.m_floats[1] = worldEdgeB.m_floats[1];
    wA_2.m_floats[2] = worldEdgeB.m_floats[2];
    wA_2.m_floats[3] = worldEdgeB.m_floats[3];
    worldEdgeB.m_floats = cVar37.m_floats;
    cbtSegmentsClosestPoints(&wA,&wB,(cbtVector3 *)&d,&dist,&tB,&WorldEdge1,&dirA,1e+30,&wA_2,1e+30)
    ;
    auVar24._0_4_ = cbtVector3::length2(&wA);
    auVar24._4_60_ = extraout_var;
    if (1.1920929e-07 < auVar24._0_4_) {
      if (auVar24._0_4_ < 0.0) {
        auVar25._0_4_ = sqrtf(auVar24._0_4_);
        auVar25._4_60_ = extraout_var_00;
        auVar12 = auVar25._0_16_;
      }
      else {
        auVar12 = vsqrtss_avx(auVar24._0_16_,auVar24._0_16_);
      }
      fVar36 = 1.0 / auVar12._0_4_;
      auVar28._0_4_ = fVar36 * wA.m_floats[0];
      auVar28._4_4_ = fVar36 * wA.m_floats[1];
      auVar28._8_4_ = fVar36 * 0.0;
      auVar28._12_4_ = fVar36 * 0.0;
      auVar13 = vmovshdup_avx(auVar28);
      wA.m_floats._0_8_ = vmovlps_avx(auVar28);
      fVar36 = fVar36 * wA.m_floats[2];
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * DeltaC2.m_floats[1])),auVar28,
                                ZEXT416((uint)DeltaC2.m_floats[0]));
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar36),ZEXT416((uint)DeltaC2.m_floats[2]));
      if (auVar13._0_4_ < 0.0) {
        uVar6 = CONCAT44(auVar28._4_4_,auVar28._0_4_);
        auVar13._0_8_ = uVar6 ^ 0x8000000080000000;
        auVar13._8_4_ = -auVar28._8_4_;
        auVar13._12_4_ = -auVar28._12_4_;
        wA.m_floats._0_8_ = vmovlps_avx(auVar13);
        fVar36 = -fVar36;
      }
      wA.m_floats[2] = fVar36;
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar12 = vxorps_avx512vl(auVar12,auVar5);
      auVar29._0_4_ = (float)_d + (float)local_88._0_4_;
      auVar29._4_4_ = SUB84(_d,4) + (float)local_88._4_4_;
      auVar29._8_4_ = fStack_80 + 0.0;
      auVar29._12_4_ = fStack_7c + 0.0;
      wB_2.m_floats =
           (cbtScalar  [4])vinsertps_avx(auVar29,ZEXT416((uint)(local_15c + (float)uStack_e0)),0x28)
      ;
      (*resultOut->_vptr_Result[4])(auVar12._0_8_,resultOut,&wA);
    }
  }
  pcVar8 = local_100;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(DeltaC2.m_floats[1] * local_100->m_floats[1])),
                            ZEXT416((uint)DeltaC2.m_floats[0]),ZEXT416((uint)local_100->m_floats[0])
                           );
  auVar12 = vfmadd132ss_fma(ZEXT416((uint)DeltaC2.m_floats[2]),auVar12,
                            ZEXT416((uint)local_100->m_floats[2]));
  auVar27 = ZEXT856(auVar12._8_8_);
  auVar35 = ZEXT856(0);
  if (auVar12._0_4_ < 0.0) {
    cVar37 = ::operator-(local_100);
    auVar34._0_8_ = cVar37.m_floats._8_8_;
    auVar34._8_56_ = auVar35;
    auVar26._0_8_ = cVar37.m_floats._0_8_;
    auVar26._8_56_ = auVar27;
    auVar12 = vmovlhps_avx(auVar26._0_16_,auVar34._0_16_);
    *(undefined1 (*) [16])pcVar8->m_floats = auVar12;
  }
LAB_00e11990:
  return (bool)(char)uVar11;
LAB_00e116a8:
  uVar11 = 0;
  goto LAB_00e11990;
}

Assistant:

bool cbtPolyhedralContactClipping::findSeparatingAxis(const cbtConvexPolyhedron& hullA, const cbtConvexPolyhedron& hullB, const cbtTransform& transA, const cbtTransform& transB, cbtVector3& sep, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	gActualSATPairTests++;

	//#ifdef TEST_INTERNAL_OBJECTS
	const cbtVector3 c0 = transA * hullA.m_localCenter;
	const cbtVector3 c1 = transB * hullB.m_localCenter;
	const cbtVector3 DeltaC2 = c0 - c1;
	//#endif

	cbtScalar dmin = FLT_MAX;
	int curPlaneTests = 0;

	int numFacesA = hullA.m_faces.size();
	// Test normals from hullA
	for (int i = 0; i < numFacesA; i++)
	{
		const cbtVector3 Normal(hullA.m_faces[i].m_plane[0], hullA.m_faces[i].m_plane[1], hullA.m_faces[i].m_plane[2]);
		cbtVector3 faceANormalWS = transA.getBasis() * Normal;
		if (DeltaC2.dot(faceANormalWS) < 0)
			faceANormalWS *= -1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, faceANormalWS, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		cbtScalar d;
		cbtVector3 wA, wB;
		if (!TestSepAxis(hullA, hullB, transA, transB, faceANormalWS, d, wA, wB))
			return false;

		if (d < dmin)
		{
			dmin = d;
			sep = faceANormalWS;
		}
	}

	int numFacesB = hullB.m_faces.size();
	// Test normals from hullB
	for (int i = 0; i < numFacesB; i++)
	{
		const cbtVector3 Normal(hullB.m_faces[i].m_plane[0], hullB.m_faces[i].m_plane[1], hullB.m_faces[i].m_plane[2]);
		cbtVector3 WorldNormal = transB.getBasis() * Normal;
		if (DeltaC2.dot(WorldNormal) < 0)
			WorldNormal *= -1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, WorldNormal, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		cbtScalar d;
		cbtVector3 wA, wB;
		if (!TestSepAxis(hullA, hullB, transA, transB, WorldNormal, d, wA, wB))
			return false;

		if (d < dmin)
		{
			dmin = d;
			sep = WorldNormal;
		}
	}

	cbtVector3 edgeAstart, edgeAend, edgeBstart, edgeBend;
	int edgeA = -1;
	int edgeB = -1;
	cbtVector3 worldEdgeA;
	cbtVector3 worldEdgeB;
	cbtVector3 witnessPointA(0, 0, 0), witnessPointB(0, 0, 0);

	int curEdgeEdge = 0;
	// Test edges
	for (int e0 = 0; e0 < hullA.m_uniqueEdges.size(); e0++)
	{
		const cbtVector3 edge0 = hullA.m_uniqueEdges[e0];
		const cbtVector3 WorldEdge0 = transA.getBasis() * edge0;
		for (int e1 = 0; e1 < hullB.m_uniqueEdges.size(); e1++)
		{
			const cbtVector3 edge1 = hullB.m_uniqueEdges[e1];
			const cbtVector3 WorldEdge1 = transB.getBasis() * edge1;

			cbtVector3 Cross = WorldEdge0.cross(WorldEdge1);
			curEdgeEdge++;
			if (!IsAlmostZero(Cross))
			{
				Cross = Cross.normalize();
				if (DeltaC2.dot(Cross) < 0)
					Cross *= -1.f;

#ifdef TEST_INTERNAL_OBJECTS
				gExpectedNbTests++;
				if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, Cross, hullA, hullB, dmin))
					continue;
				gActualNbTests++;
#endif

				cbtScalar dist;
				cbtVector3 wA, wB;
				if (!TestSepAxis(hullA, hullB, transA, transB, Cross, dist, wA, wB))
					return false;

				if (dist < dmin)
				{
					dmin = dist;
					sep = Cross;
					edgeA = e0;
					edgeB = e1;
					worldEdgeA = WorldEdge0;
					worldEdgeB = WorldEdge1;
					witnessPointA = wA;
					witnessPointB = wB;
				}
			}
		}
	}

	if (edgeA >= 0 && edgeB >= 0)
	{
		//		printf("edge-edge\n");
		//add an edge-edge contact

		cbtVector3 ptsVector;
		cbtVector3 offsetA;
		cbtVector3 offsetB;
		cbtScalar tA;
		cbtScalar tB;

		cbtVector3 translation = witnessPointB - witnessPointA;

		cbtVector3 dirA = worldEdgeA;
		cbtVector3 dirB = worldEdgeB;

		cbtScalar hlenB = 1e30f;
		cbtScalar hlenA = 1e30f;

		cbtSegmentsClosestPoints(ptsVector, offsetA, offsetB, tA, tB,
								translation,
								dirA, hlenA,
								dirB, hlenB);

		cbtScalar nlSqrt = ptsVector.length2();
		if (nlSqrt > SIMD_EPSILON)
		{
			cbtScalar nl = cbtSqrt(nlSqrt);
			ptsVector *= 1.f / nl;
			if (ptsVector.dot(DeltaC2) < 0.f)
			{
				ptsVector *= -1.f;
			}
			cbtVector3 ptOnB = witnessPointB + offsetB;
			cbtScalar distance = nl;
			resultOut.addContactPoint(ptsVector, ptOnB, -distance);
		}
	}

	if ((DeltaC2.dot(sep)) < 0.0f)
		sep = -sep;

	return true;
}